

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[27],char_const*,char[18],char_const*>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [27],
                   char **args_1,char (*args_2) [18],char **args_3)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_168;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  cmAlphaNum local_d8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [18];
  char (*args_local_2) [18];
  char **args_local_1;
  char (*args_local) [27];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [18])args_1;
  args_local_1 = (char **)args;
  args_local = (char (*) [27])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_a8 = cmAlphaNum::View(a);
  local_98 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_d8,(char *)args_local_1);
  local_88 = cmAlphaNum::View(&local_d8);
  cmAlphaNum::cmAlphaNum(&local_108,*(char **)*args_local_2);
  local_78 = cmAlphaNum::View(&local_108);
  cmAlphaNum::cmAlphaNum(&local_138,*local_38);
  local_68 = cmAlphaNum::View(&local_138);
  cmAlphaNum::cmAlphaNum(&local_168,*args_3);
  local_58 = cmAlphaNum::View(&local_168);
  local_48 = &local_a8;
  local_40 = 6;
  views._M_len = 6;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}